

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

code_point nowide::utf::utf_traits<char,1>::decode<char_const*>(char **p,char *e)

{
  byte ci;
  byte *pbVar1;
  code_point cVar2;
  int iVar3;
  int iVar4;
  uchar c;
  uint uVar5;
  code_point cVar6;
  code_point cVar7;
  
  pbVar1 = (byte *)*p;
  cVar2 = 0xfffffffe;
  cVar6 = cVar2;
  if (pbVar1 != (byte *)e) {
    *p = (char *)(pbVar1 + 1);
    ci = *pbVar1;
    iVar3 = utf_traits<char,_1>::trail_length(ci);
    if (iVar3 < 0) {
      cVar6 = 0xffffffff;
    }
    else {
      cVar6 = (uint)ci;
      if (iVar3 != 0) {
        cVar7 = 0xffffffff;
        uVar5 = ~(-1 << (6U - (char)iVar3 & 0x1f)) & (uint)ci;
        if (iVar3 == 3) {
          cVar6 = cVar2;
          if (*p != e) {
            *p = *p + 1;
            cVar6 = cVar7;
          }
        }
        else if (iVar3 == 2) {
          cVar6 = cVar2;
          if (*p != e) {
            *p = *p + 1;
            cVar6 = cVar7;
          }
        }
        else if (iVar3 == 1) {
          cVar6 = cVar2;
          if (*p != e) {
            *p = *p + 1;
            cVar6 = cVar7;
          }
        }
        else {
          cVar6 = cVar7;
          if (uVar5 < 0x110000) {
            if (uVar5 < 0x80) {
              iVar4 = 1;
            }
            else if (uVar5 < 0x800) {
              iVar4 = 2;
            }
            else {
              iVar4 = 4 - (uint)(uVar5 < 0x10000);
            }
            cVar6 = 0xffffffff;
            if (iVar4 == iVar3 + 1) {
              cVar6 = uVar5;
            }
          }
        }
      }
    }
  }
  return cVar6;
}

Assistant:

static code_point decode(Iterator &p,Iterator e)
        {
            if(NOWIDE_UNLIKELY(p==e))
                return incomplete;

            unsigned char lead = *p++;

            // First byte is fully validated here
            int trail_size = trail_length(lead);

            if(NOWIDE_UNLIKELY(trail_size < 0))
                return illegal;

            //
            // Ok as only ASCII may be of size = 0
            // also optimize for ASCII text
            //
            if(trail_size == 0)
                return lead;
            
            code_point c = lead & ((1<<(6-trail_size))-1);

            // Read the rest
            unsigned char tmp;
            switch(trail_size) {
            case 3:
                if(NOWIDE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            case 2:
                if(NOWIDE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            case 1:
                if(NOWIDE_UNLIKELY(p==e))
                    return incomplete;
                tmp = *p++;
                if (!is_trail(tmp))
                    return illegal;
                c = (c << 6) | ( tmp & 0x3F);
            }

            // Check code point validity: no surrogates and
            // valid range
            if(NOWIDE_UNLIKELY(!is_valid_codepoint(c)))
                return illegal;

            // make sure it is the most compact representation
            if(NOWIDE_UNLIKELY(width(c)!=trail_size + 1))
                return illegal;

            return c;

        }